

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void gen_spr_book3s_dbg(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if ((((env->spr_cb[0x3f5].name == (char *)0x0) && (env->spr[0x3f5] == 0)) &&
      (env->spr_cb[0x3f5].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x3f5].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x3f5].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x3f5].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x3f5].name = "DABR";
    env->spr_cb[0x3f5].uea_read = spr_noaccess;
    env->spr_cb[0x3f5].uea_write = spr_noaccess;
    env->spr_cb[0x3f5].oea_read = spr_read_generic;
    env->spr_cb[0x3f5].oea_write = spr_write_generic;
    env->spr_cb[0x3f5].hea_read = spr_read_generic;
    env->spr_cb[0x3f5].hea_write = spr_write_generic;
    env->spr_cb[0x3f5].default_value = 0;
    env->spr[0x3f5] = 0;
    if (((env->spr_cb[0x3f7].name == (char *)0x0) && (env->spr[0x3f7] == 0)) &&
       ((env->spr_cb[0x3f7].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3f7].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3f7].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3f7].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3f7].name = "DABRX";
      env->spr_cb[0x3f7].uea_read = spr_noaccess;
      env->spr_cb[0x3f7].uea_write = spr_noaccess;
      env->spr_cb[0x3f7].oea_read = spr_read_generic;
      env->spr_cb[0x3f7].oea_write = spr_write_generic;
      env->spr_cb[0x3f7].hea_read = spr_read_generic;
      env->spr_cb[0x3f7].hea_write = spr_write_generic;
      env->spr_cb[0x3f7].default_value = 0;
      env->spr[0x3f7] = 0;
      return;
    }
    uVar2 = 0x3f7;
    uVar1 = 0x3f7;
  }
  else {
    uVar2 = 0x3f5;
    uVar1 = 0x3f5;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_spr_book3s_dbg(CPUPPCState *env)
{
    /*
     * TODO: different specs define different scopes for these,
     * will have to address this:
     * 970: super/write and super/read
     * powerisa 2.03..2.04: hypv/write and super/read.
     * powerisa 2.05 and newer: hypv/write and hypv/read.
     */
    spr_register_kvm(env, SPR_DABR, "DABR",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_generic,
                     KVM_REG_PPC_DABR, 0x00000000);
    spr_register_kvm(env, SPR_DABRX, "DABRX",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_generic,
                     KVM_REG_PPC_DABRX, 0x00000000);
}